

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createTrianglePlane
          (Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  BBox1f time_range;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  _func_int **pp_Var13;
  reference pvVar14;
  unsigned_long *puVar15;
  Vec3fa *pVVar16;
  long lVar17;
  size_type __n;
  reference pvVar18;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Node *in_RDI;
  ulong in_R8;
  ulong in_R9;
  float fVar19;
  long *in_stack_00000008;
  size_t p11;
  size_t p10;
  size_t p01;
  size_t p00;
  size_t i_5;
  size_t x_1;
  size_t y_1;
  size_t i_4;
  Vec3fa p;
  size_t x;
  size_t y;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  void *in_stack_fffffffffffff9c8;
  size_t in_stack_fffffffffffff9d0;
  size_t in_stack_fffffffffffff9d8;
  size_type in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffa60;
  TriangleMeshNode *in_stack_fffffffffffffa68;
  float in_stack_fffffffffffffa70;
  float in_stack_fffffffffffffa74;
  float local_560;
  float local_558;
  float local_54c;
  float local_53c;
  ulong local_4a0;
  ulong local_498;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined1 local_458 [4];
  float fStack_454;
  float fStack_450;
  ulong local_448;
  ulong local_440;
  undefined1 local_435;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 uStack_428;
  long *local_418;
  _func_int **local_410;
  ulong local_408;
  ulong local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined8 *local_3e8;
  long **local_3d0;
  undefined4 *local_3c8;
  undefined4 *local_3c0;
  undefined4 *local_3b8;
  _func_int **local_3b0;
  _func_int ***local_3a8;
  long **local_3a0;
  _func_int ***local_390;
  _func_int ***local_388;
  _func_int ***local_380;
  _func_int ***local_378;
  _func_int ***local_370;
  _func_int ***local_368;
  _func_int ***local_360;
  _func_int ***local_358;
  _func_int ***local_350;
  _func_int ***local_348;
  _func_int ***local_340;
  ulong local_338;
  reference local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined1 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e0;
  float local_2d4;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b0;
  float local_2a4;
  undefined8 *local_2a0;
  long local_298;
  reference local_290;
  long local_288;
  reference local_280;
  long local_278;
  reference local_270;
  _func_int ***local_268;
  _func_int ***local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 *local_1d8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 *local_170;
  float local_164;
  undefined8 *local_160;
  float local_154;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  ulong local_c8;
  ulong local_c0;
  Vec3fa *local_b8;
  ulong local_b0;
  ulong local_a8;
  size_t local_a0;
  ulong local_98;
  reference local_90;
  Vec3fa *local_88;
  Vec3fa *local_80;
  Vec3fa *local_78;
  Vec3fa *local_70;
  size_t local_68;
  Vec3fa *local_60;
  reference local_58;
  size_t local_50;
  reference local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  _func_int **local_10;
  
  local_408 = in_R9;
  local_400 = in_R8;
  local_3f8 = in_RCX;
  local_3f0 = in_RDX;
  local_3e8 = in_RSI;
  pp_Var13 = (_func_int **)::operator_new(0xd8);
  local_435 = 1;
  local_3d0 = &local_418;
  local_418 = (long *)*in_stack_00000008;
  if (local_418 != (long *)0x0) {
    (**(code **)(*local_418 + 0x10))();
  }
  local_430 = 0;
  local_434 = 0x3f800000;
  local_3b8 = &local_42c;
  local_3c0 = &local_430;
  local_3c8 = &local_434;
  local_42c = 0;
  uStack_428 = 0x3f800000;
  time_range.upper = in_stack_fffffffffffffa74;
  time_range.lower = in_stack_fffffffffffffa70;
  TriangleMeshNode::TriangleMeshNode
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,time_range,
             CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  local_435 = 0;
  local_3a8 = &local_410;
  local_3b0 = pp_Var13;
  local_410 = pp_Var13;
  if (pp_Var13 != (_func_int **)0x0) {
    (**(code **)(*pp_Var13 + 0x10))();
  }
  local_3a0 = &local_418;
  if (local_418 != (long *)0x0) {
    (**(code **)(*local_418 + 0x18))();
  }
  local_340 = &local_410;
  pvVar14 = std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)(local_410 + 0xe),0);
  local_98 = (local_400 + 1) * (local_408 + 1);
  local_338 = local_98;
  local_330 = pvVar14;
  local_28 = local_98;
  local_20 = pvVar14;
  if (pvVar14->size_alloced < local_98) {
    local_18 = local_98;
    if (pvVar14->size_alloced != 0) {
      local_30 = pvVar14->size_alloced;
      while (local_30 < local_28) {
        local_40[1] = 1;
        local_40[0] = local_30 << 1;
        puVar15 = std::max<unsigned_long>(local_40 + 1,local_40);
        local_30 = *puVar15;
      }
      local_18 = local_30;
    }
  }
  else {
    local_18 = pvVar14->size_alloced;
  }
  local_a0 = local_18;
  uVar10 = local_98;
  if (local_98 < pvVar14->size_active) {
    while (local_a8 = uVar10, local_a8 < pvVar14->size_active) {
      uVar10 = local_a8 + 1;
    }
    pvVar14->size_active = local_98;
  }
  local_90 = pvVar14;
  if (local_18 == pvVar14->size_alloced) {
    for (local_b0 = pvVar14->size_active; local_b0 < local_98; local_b0 = local_b0 + 1) {
      local_88 = pvVar14->items + local_b0;
    }
    pvVar14->size_active = local_98;
  }
  else {
    local_b8 = pvVar14->items;
    local_50 = local_18;
    local_48 = pvVar14;
    pVVar16 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0);
    pvVar14->items = pVVar16;
    for (local_c0 = 0; local_c0 < pvVar14->size_active; local_c0 = local_c0 + 1) {
      local_70 = pvVar14->items + local_c0;
      local_78 = local_b8 + local_c0;
      uVar1 = *(undefined8 *)((long)&local_78->field_0 + 8);
      *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
      *(undefined8 *)((long)&local_70->field_0 + 8) = uVar1;
    }
    for (local_c8 = pvVar14->size_active; local_c8 < local_98; local_c8 = local_c8 + 1) {
      local_80 = pvVar14->items + local_c8;
    }
    local_68 = pvVar14->size_alloced;
    local_60 = local_b8;
    local_58 = pvVar14;
    alignedFree(in_stack_fffffffffffff9c8);
    pvVar14->size_active = local_98;
    pvVar14->size_alloced = local_a0;
  }
  local_348 = &local_410;
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::resize((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
            *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
           in_stack_fffffffffffff9e8);
  for (local_440 = 0; local_440 <= local_408; local_440 = local_440 + 1) {
    for (local_448 = 0; local_448 <= local_400; local_448 = local_448 + 1) {
      local_53c = (float)local_448;
      local_54c = (float)local_400;
      local_2a4 = local_53c / local_54c;
      local_2a0 = &local_478;
      local_2b0 = local_3f0;
      local_160 = &local_2c8;
      local_118 = CONCAT44(local_2a4,local_2a4);
      uStack_110 = CONCAT44(local_2a4,local_2a4);
      local_1c0 = &local_478;
      local_1c8 = &local_2c8;
      local_1d0 = local_3f0;
      uVar1 = *local_3f0;
      uVar2 = local_3f0[1];
      local_128._0_4_ = (float)uVar1;
      local_128._4_4_ = (float)((ulong)uVar1 >> 0x20);
      uStack_120._0_4_ = (float)uVar2;
      uStack_120._4_4_ = (float)((ulong)uVar2 >> 0x20);
      local_1b8 = local_2a4 * (float)local_128;
      fStack_1b4 = local_2a4 * local_128._4_4_;
      fStack_1b0 = local_2a4 * (float)uStack_120;
      fStack_1ac = local_2a4 * uStack_120._4_4_;
      local_1a8 = &local_478;
      local_248 = CONCAT44(fStack_1b4,local_1b8);
      uStack_240 = CONCAT44(fStack_1ac,fStack_1b0);
      local_300 = &local_468;
      local_308 = local_3e8;
      local_310 = &local_478;
      uVar3 = *local_3e8;
      uVar4 = local_3e8[1];
      local_238._0_4_ = (float)uVar3;
      local_238._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_230._0_4_ = (float)uVar4;
      uStack_230._4_4_ = (float)((ulong)uVar4 >> 0x20);
      local_208 = (float)local_238 + local_1b8;
      fStack_204 = local_238._4_4_ + fStack_1b4;
      fStack_200 = (float)uStack_230 + fStack_1b0;
      fStack_1fc = uStack_230._4_4_ + fStack_1ac;
      local_1f0 = &local_468;
      local_218 = CONCAT44(fStack_204,local_208);
      uStack_210 = CONCAT44(fStack_1fc,fStack_200);
      local_558 = (float)local_440;
      local_560 = (float)local_408;
      local_2d4 = local_558 / local_560;
      local_2d0 = &local_488;
      local_2e0 = local_3f8;
      local_150 = &local_2f8;
      local_138 = CONCAT44(local_2d4,local_2d4);
      uStack_130 = CONCAT44(local_2d4,local_2d4);
      local_190 = &local_488;
      local_198 = &local_2f8;
      local_1a0 = local_3f8;
      uVar5 = *local_3f8;
      uVar6 = local_3f8[1];
      local_148._0_4_ = (float)uVar5;
      local_148._4_4_ = (float)((ulong)uVar5 >> 0x20);
      uStack_140._0_4_ = (float)uVar6;
      uStack_140._4_4_ = (float)((ulong)uVar6 >> 0x20);
      local_188 = local_2d4 * (float)local_148;
      fStack_184 = local_2d4 * local_148._4_4_;
      fStack_180 = local_2d4 * (float)uStack_140;
      fStack_17c = local_2d4 * uStack_140._4_4_;
      local_170 = &local_488;
      local_228 = CONCAT44(fStack_184,local_188);
      uStack_220 = CONCAT44(fStack_17c,fStack_180);
      local_318 = local_458;
      local_320 = &local_468;
      local_328 = &local_488;
      fVar19 = local_208 + local_188;
      fStack_454 = fStack_204 + fStack_184;
      fStack_450 = fStack_200 + fStack_180;
      fStack_1dc = fStack_1fc + fStack_17c;
      local_1d8 = local_458;
      lVar17 = local_440 * (local_400 + 1) + local_448;
      local_350 = &local_410;
      local_238 = uVar3;
      uStack_230 = uVar4;
      local_1e8 = fVar19;
      fStack_1e4 = fStack_454;
      fStack_1e0 = fStack_450;
      local_164 = local_2a4;
      local_154 = local_2d4;
      local_148 = uVar5;
      uStack_140 = uVar6;
      local_128 = uVar1;
      uStack_120 = uVar2;
      local_108 = local_2d4;
      fStack_104 = local_2d4;
      fStack_100 = local_2d4;
      fStack_fc = local_2d4;
      local_f8 = local_2d4;
      local_e8 = local_2a4;
      fStack_e4 = local_2a4;
      fStack_e0 = local_2a4;
      fStack_dc = local_2a4;
      local_d8 = local_2a4;
      local_488 = local_228;
      uStack_480 = uStack_220;
      local_478 = local_248;
      uStack_470 = uStack_240;
      local_468 = local_218;
      uStack_460 = uStack_210;
      local_2f8 = local_138;
      uStack_2f0 = uStack_130;
      local_2c8 = local_118;
      uStack_2c0 = uStack_110;
      local_270 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_410 + 0xe),0);
      local_270->items[lVar17].field_0.m128[0] = fVar19;
      local_358 = &local_410;
      local_278 = lVar17;
      local_280 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_410 + 0xe),0);
      local_280->items[lVar17].field_0.m128[1] = fStack_454;
      local_360 = &local_410;
      local_288 = lVar17;
      local_290 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_410 + 0xe),0);
      local_290->items[lVar17].field_0.m128[2] = fStack_450;
      local_298 = lVar17;
    }
  }
  for (local_498 = 0; local_498 < local_408; local_498 = local_498 + 1) {
    for (local_4a0 = 0; local_4a0 < local_400; local_4a0 = local_4a0 + 1) {
      __n = local_498 * 2 * local_400 + local_4a0 * 2;
      iVar9 = (int)local_400;
      iVar8 = (int)local_498;
      iVar7 = (int)local_4a0;
      uVar11 = iVar8 * (iVar9 + 1) + iVar7 + 1;
      uVar12 = (iVar8 + 1) * (iVar9 + 1) + iVar7;
      local_368 = &local_410;
      pvVar18 = std::
                vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                              *)(local_410 + 0x17),__n);
      pvVar18->v0 = iVar8 * (iVar9 + 1) + iVar7;
      local_370 = &local_410;
      pvVar18 = std::
                vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                              *)(local_410 + 0x17),__n);
      pvVar18->v1 = uVar11;
      local_378 = &local_410;
      pvVar18 = std::
                vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                              *)(local_410 + 0x17),__n);
      pvVar18->v2 = uVar12;
      local_380 = &local_410;
      pvVar18 = std::
                vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                              *)(local_410 + 0x17),__n + 1);
      pvVar18->v0 = (iVar8 + 1) * (iVar9 + 1) + iVar7 + 1;
      local_388 = &local_410;
      pvVar18 = std::
                vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                              *)(local_410 + 0x17),__n + 1);
      pvVar18->v1 = uVar12;
      local_390 = &local_410;
      pvVar18 = std::
                vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                              *)(local_410 + 0x17),__n + 1);
      pvVar18->v2 = uVar11;
    }
  }
  local_268 = &local_410;
  local_10 = local_410;
  (in_RDI->super_RefCount)._vptr_RefCount = local_410;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_258 = &local_410;
  if (local_410 != (_func_int **)0x0) {
    (**(code **)(*local_410 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createTrianglePlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->triangles.resize(2*width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = 2*y*width+2*x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->triangles[i+0].v0 = unsigned(p00); mesh->triangles[i+0].v1 = unsigned(p01); mesh->triangles[i+0].v2 = unsigned(p10);
        mesh->triangles[i+1].v0 = unsigned(p11); mesh->triangles[i+1].v1 = unsigned(p10); mesh->triangles[i+1].v2 = unsigned(p01);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }